

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifnob(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  voccxdef *voc;
  vocidef *v;
  int iVar2;
  runcxdef *prVar3;
  vocidef ***pppvVar4;
  uint uVar5;
  objnum cls;
  ulong uVar6;
  vocidef **ppvVar7;
  vocidef **ppvVar8;
  ushort obj;
  
  prVar3 = ctx->bifcxrun;
  prVar1 = prVar3->runcxsp;
  voc = prVar3->runcxvoc;
  prVar3->runcxsp = prVar1 + -1;
  prVar3 = ctx->bifcxrun;
  if (prVar1[-1].runstyp != '\x02') {
LAB_00211e9a:
    prVar3->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f2);
  }
  prVar1 = prVar3->runcxsp;
  obj = (prVar1->runsv).runsvobj;
  cls = 0xffff;
  if (argc != 1) {
    if (argc != 2) {
      prVar3->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x401);
    }
    prVar3->runcxsp = prVar1 + -1;
    prVar3 = ctx->bifcxrun;
    if (prVar1[-1].runstyp != '\x02') goto LAB_00211e9a;
    cls = (prVar3->runcxsp->runsv).runsvobj;
  }
  uVar5 = obj & 0xff;
  uVar6 = (ulong)(obj >> 8);
  pppvVar4 = voc->voccxinh + uVar6;
  ppvVar7 = (vocidef **)((ulong)(uVar5 * 8) + (long)*pppvVar4);
LAB_00211df8:
  do {
    uVar5 = uVar5 + 1;
    ppvVar7 = ppvVar7 + 1;
    ppvVar8 = ppvVar7;
    if (uVar5 == 0x100) {
      uVar6 = (ulong)((int)uVar6 + 1);
      ppvVar8 = pppvVar4[1];
      pppvVar4 = pppvVar4 + 1;
      uVar5 = 0;
      if (ppvVar8 == (vocidef **)0x0) {
        obj = obj + 0x100;
        uVar5 = 0xff;
        goto LAB_00211df8;
      }
    }
    if (0x7f < (int)uVar6) {
      runpnil(ctx->bifcxrun);
      return;
    }
    obj = obj + 1;
    v = *ppvVar8;
    ppvVar7 = ppvVar8;
    if (((v != (vocidef *)0x0) && (((v->vociu).vocius.vociusflg & 1) == 0)) &&
       ((cls == 0xffff || (iVar2 = bifinh(voc,v,cls), iVar2 != 0)))) {
      runpobj(ctx->bifcxrun,obj);
      return;
    }
  } while( true );
}

Assistant:

void bifnob(bifcxdef *ctx, int argc)
{
    objnum     prv;
    vocidef ***vpg;
    vocidef  **v;
    objnum     obj;
    int        i;
    int        j;
    objnum     cls;
    voccxdef  *voc = ctx->bifcxrun->runcxvoc;

    /* get last position in search */
    prv = runpopobj(ctx->bifcxrun);
    
    /* get class to search for, if one is specified */
    if (argc == 1)
        cls = MCMONINV;
    else if (argc == 2)
        cls = runpopobj(ctx->bifcxrun);
    else
        runsig(ctx->bifcxrun, ERR_BIFARGC);
    
    /* start at previous object plus 1 */
    i = (prv >> 8);
    vpg = voc->voccxinh + i;
    j = (prv & 255);
    obj = prv;
    v = (*vpg) + j;
    
    for (;;)
    {
        ++j;
        ++obj;
        ++v;
        if (j == 256)
        {
            j = 0;
            ++i;
            ++vpg;
            if (!*vpg)
            {
                obj += 255;
                j += 255;
                continue;
            }
            v = (*vpg);
        }
        if (i >= VOCINHMAX)
        {
            runpnil(ctx->bifcxrun);
            return;
        }
        
        if (!*v || ((*v)->vociflg & VOCIFCLASS)
            || (cls != MCMONINV && !bifinh(voc, *v, cls)))
            continue;
            
        /* this is an object we can use - push it */
        runpobj(ctx->bifcxrun, obj);
        return;
    }
}